

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

double __thiscall icu_63::MoonTimeAngleFunc::eval(MoonTimeAngleFunc *this,CalendarAstronomer *a)

{
  double dVar1;
  double dVar2;
  
  CalendarAstronomer::getMoonPosition(a);
  dVar1 = a->moonEclipLong - a->sunLongitude;
  dVar2 = uprv_floor_63(dVar1 / 6.283185307179586);
  return dVar2 * -6.283185307179586 + dVar1;
}

Assistant:

virtual double eval(CalendarAstronomer&a) { return a.getMoonAge(); }